

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_input_auth(connectdata *conn,_Bool proxy,char *auth)

{
  char *pcVar1;
  long lVar2;
  unsigned_long *puVar3;
  char cVar4;
  Curl_easy *data;
  unsigned_long uVar5;
  _Bool _Var6;
  int iVar7;
  CURLcode CVar8;
  ushort **ppuVar9;
  byte bVar10;
  ulong uVar11;
  
  if (*auth == '\0') {
    return CURLE_OK;
  }
  data = conn->data;
  lVar2 = (ulong)!proxy * 8;
  do {
    iVar7 = curl_strnequal("NTLM",auth,4);
    if (iVar7 == 0) {
      iVar7 = curl_strnequal("Digest",auth,6);
      if (iVar7 == 0) {
        iVar7 = curl_strnequal("Basic",auth,5);
        if (iVar7 != 0) {
          pcVar1 = (data->info).conn_primary_ip + lVar2 + -0x28;
          *pcVar1 = *pcVar1 | 1;
          puVar3 = &(&(data->state).authhost)[proxy].avail;
          *(byte *)puVar3 = (byte)*puVar3 | 1;
          if ((&(data->state).authhost)[proxy].picked == 1) {
            (&(data->state).authhost)[proxy].avail = 0;
            goto LAB_00110ae2;
          }
        }
      }
      else if (((&(data->state).authhost)[proxy].avail & 2) == 0) {
        _Var6 = Curl_auth_is_digest_supported();
        if (_Var6) {
          pcVar1 = (data->info).conn_primary_ip + lVar2 + -0x28;
          *pcVar1 = *pcVar1 | 2;
          puVar3 = &(&(data->state).authhost)[proxy].avail;
          *(byte *)puVar3 = (byte)*puVar3 | 2;
          CVar8 = Curl_input_digest(conn,proxy,auth);
          if (CVar8 != CURLE_OK) goto LAB_00110ae2;
        }
      }
      else {
        Curl_infof(data,"Ignoring duplicate digest auth header.\n");
      }
    }
    else {
      uVar11 = (&(data->state).authhost)[proxy].avail;
      if ((uVar11 & 0x28) == 0) {
        _Var6 = Curl_auth_is_ntlm_supported();
        if (!_Var6) goto LAB_00110bb0;
        uVar11 = (&(data->state).authhost)[proxy].avail;
      }
      pcVar1 = (data->info).conn_primary_ip + lVar2 + -0x28;
      *pcVar1 = *pcVar1 | 8;
      (&(data->state).authhost)[proxy].avail = uVar11 | 8;
      uVar5 = (&(data->state).authhost)[proxy].picked;
      if ((uVar5 == 0x20) || (uVar5 == 8)) {
        CVar8 = Curl_input_ntlm(conn,proxy,auth);
        if (CVar8 == CURLE_OK) {
          (data->state).authproblem = false;
        }
        else {
LAB_00110ae2:
          Curl_infof(data,"Authentication problem. Ignoring this.\n");
          (data->state).authproblem = true;
        }
      }
    }
LAB_00110bb0:
    for (; (cVar4 = *auth, cVar4 != '\0' && (cVar4 != ',')); auth = auth + 1) {
    }
    uVar11 = (ulong)(cVar4 == ',');
    bVar10 = auth[uVar11];
    if (bVar10 == 0) {
      return CURLE_OK;
    }
    ppuVar9 = __ctype_b_loc();
    while ((*(byte *)((long)*ppuVar9 + (ulong)bVar10 * 2 + 1) & 0x20) != 0) {
      bVar10 = auth[uVar11 + 1];
      uVar11 = uVar11 + 1;
      if (bVar10 == 0) {
        return CURLE_OK;
      }
    }
    auth = auth + uVar11;
  } while( true );
}

Assistant:

CURLcode Curl_http_input_auth(struct connectdata *conn, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
  struct Curl_easy *data = conn->data;

#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy?
    &data->state.proxyneg:&data->state.negotiate;
#endif
  unsigned long *availp;
  struct auth *authp;

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(checkprefix("Negotiate", auth)) {
      if((authp->avail & CURLAUTH_NEGOTIATE) ||
         Curl_auth_is_spnego_supported()) {
        *availp |= CURLAUTH_NEGOTIATE;
        authp->avail |= CURLAUTH_NEGOTIATE;

        if(authp->picked == CURLAUTH_NEGOTIATE) {
          if(negdata->state == GSS_AUTHSENT ||
             negdata->state == GSS_AUTHNONE) {
            CURLcode result = Curl_input_negotiate(conn, proxy, auth);
            if(!result) {
              DEBUGASSERT(!data->req.newurl);
              data->req.newurl = strdup(data->change.url);
              if(!data->req.newurl)
                return CURLE_OUT_OF_MEMORY;
              data->state.authproblem = FALSE;
              /* we received a GSS auth token and we dealt with it fine */
              negdata->state = GSS_AUTHRECV;
            }
            else
              data->state.authproblem = TRUE;
          }
        }
      }
    }
    else
#endif
#ifdef USE_NTLM
      /* NTLM support requires the SSL crypto libs */
      if(checkprefix("NTLM", auth)) {
        if((authp->avail & CURLAUTH_NTLM) ||
           (authp->avail & CURLAUTH_NTLM_WB) ||
           Curl_auth_is_ntlm_supported()) {
          *availp |= CURLAUTH_NTLM;
          authp->avail |= CURLAUTH_NTLM;

          if(authp->picked == CURLAUTH_NTLM ||
             authp->picked == CURLAUTH_NTLM_WB) {
            /* NTLM authentication is picked and activated */
            CURLcode result = Curl_input_ntlm(conn, proxy, auth);
            if(!result) {
              data->state.authproblem = FALSE;
#ifdef NTLM_WB_ENABLED
              if(authp->picked == CURLAUTH_NTLM_WB) {
                *availp &= ~CURLAUTH_NTLM;
                authp->avail &= ~CURLAUTH_NTLM;
                *availp |= CURLAUTH_NTLM_WB;
                authp->avail |= CURLAUTH_NTLM_WB;

                /* Get the challenge-message which will be passed to
                 * ntlm_auth for generating the type 3 message later */
                while(*auth && ISSPACE(*auth))
                  auth++;
                if(checkprefix("NTLM", auth)) {
                  auth += strlen("NTLM");
                  while(*auth && ISSPACE(*auth))
                    auth++;
                  if(*auth) {
                    conn->challenge_header = strdup(auth);
                    if(!conn->challenge_header)
                      return CURLE_OUT_OF_MEMORY;
                  }
                }
              }
#endif
            }
            else {
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }
        }
      }
      else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
        if(checkprefix("Digest", auth)) {
          if((authp->avail & CURLAUTH_DIGEST) != 0)
            infof(data, "Ignoring duplicate digest auth header.\n");
          else if(Curl_auth_is_digest_supported()) {
            CURLcode result;

            *availp |= CURLAUTH_DIGEST;
            authp->avail |= CURLAUTH_DIGEST;

            /* We call this function on input Digest headers even if Digest
             * authentication isn't activated yet, as we need to store the
             * incoming data from this header in case we are going to use
             * Digest */
            result = Curl_input_digest(conn, proxy, auth);
            if(result) {
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }
        }
        else
#endif
          if(checkprefix("Basic", auth)) {
            *availp |= CURLAUTH_BASIC;
            authp->avail |= CURLAUTH_BASIC;
            if(authp->picked == CURLAUTH_BASIC) {
              /* We asked for Basic authentication but got a 40X back
                 anyway, which basically means our name+password isn't
                 valid. */
              authp->avail = CURLAUTH_NONE;
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }

    /* there may be multiple methods on one line, so keep reading */
    while(*auth && *auth != ',') /* read up to the next comma */
      auth++;
    if(*auth == ',') /* if we're on a comma, skip it */
      auth++;
    while(*auth && ISSPACE(*auth))
      auth++;
  }

  return CURLE_OK;
}